

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ushort uVar1;
  ElementCount EVar2;
  PointerReader other;
  StructReader other_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ListReader *pLVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  word *pwVar12;
  word *__dest;
  uint i_2;
  ElementCount index;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint i_1;
  uint uVar17;
  ListReader *__begin3;
  bool bVar18;
  AllocateResult AVar19;
  OrphanBuilder *result;
  Fault f;
  uint local_e8;
  SegmentBuilder *local_e0;
  StructBuilder local_c0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  SegmentReader *local_80;
  CapTableReader *pCStack_78;
  byte *local_70;
  int iStack_68;
  undefined4 uStack_64;
  StructReader local_60;
  
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              ((Fault *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd5a,FAILED,"lists.size() > 0","\"Can\'t concat empty list \"",
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal((Fault *)&local_c0);
  }
  pLVar8 = lists.ptr + lists.size_;
  uVar13 = (ulong)(uint)structSize;
  uVar14 = (uint)structSize >> 0x10;
  lVar9 = 0;
  uVar17 = 0;
  while (uVar17 = uVar17 + *(int *)((long)&(lists.ptr)->elementCount + lVar9), uVar17 < 0x20000000)
  {
    if (((&(lists.ptr)->elementSize)[lVar9] != elementSize) &&
       (((&(lists.ptr)->elementSize)[lVar9] == BIT ||
        (bVar18 = elementSize == BIT, elementSize = INLINE_COMPOSITE, bVar18)))) goto LAB_0015163b;
    uVar16 = uVar13 & 0xffff;
    uVar13 = (ulong)*(uint *)((long)&(lists.ptr)->structDataSize + lVar9) + 0x3f >> 6;
    if (uVar13 <= uVar16) {
      uVar13 = uVar16;
    }
    uVar1 = *(ushort *)((long)&(lists.ptr)->structPointerCount + lVar9);
    if ((ushort)uVar14 <= uVar1) {
      uVar14 = (uint)uVar1;
    }
    lVar9 = lVar9 + 0x30;
    if (lists.size_ * 0x30 == lVar9) {
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      __return_storage_ptr__->location = (word *)0x0;
      (__return_storage_ptr__->tag).content = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      local_90 = (ulong)elementSize;
      if (elementSize == INLINE_COMPOSITE) {
        local_e8 = (uint)uVar13 & 0xffff;
        local_88 = (ulong)(uVar14 + ((uint)uVar13 & 0xffff));
        local_98 = local_88 * uVar17;
        if (0x1ffffffe < local_98) {
          WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&local_c0);
        }
        uVar15 = (int)local_98 + 1;
        if (arena == (BuilderArena *)0x0) {
          if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
              (int)(__return_storage_ptr__->tag).content != 0) {
            WireHelpers::zeroObject
                      ((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
          }
          if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)(ulong)uVar15
             ) {
            uVar16 = 0;
          }
          else {
            uVar16 = _DAT_00000028;
            _DAT_00000028 = _DAT_00000028 + (ulong)uVar15 * 8;
          }
          iVar7 = ((uint)(uVar16 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar16;
          AVar19 = (AllocateResult)(auVar4 << 0x40);
        }
        else {
          AVar19 = BuilderArena::allocate(arena,uVar15);
          iVar7 = -3;
        }
        pwVar12 = AVar19.words;
        local_e0 = AVar19.segment;
        *(int *)&(__return_storage_ptr__->tag).content = iVar7;
        *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)local_98 * 8 + 7;
        *(uint *)&pwVar12->content = uVar17 * 4;
        *(short *)((long)&pwVar12->content + 4) = (short)uVar13;
        *(short *)((long)&pwVar12->content + 6) = (short)uVar14;
        AVar19.words = pwVar12 + 1;
        AVar19.segment = local_e0;
        uVar13 = (ulong)(uint)((int)local_88 << 6);
        local_e8 = local_e8 << 6;
        uVar15 = (uint)local_90;
      }
      else {
        local_e8 = *(uint *)(BITS_PER_ELEMENT_TABLE + (uint)elementSize * 4);
        uVar13 = (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (uint)elementSize * 4)
        ;
        uVar16 = uVar17 * uVar13 + 0x3f >> 6;
        if (arena == (BuilderArena *)0x0) {
          if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
              (int)(__return_storage_ptr__->tag).content != 0) {
            WireHelpers::zeroObject
                      ((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
          }
          uVar16 = uVar16 & 0xffffffff;
          if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)uVar16) {
            uVar11 = 0;
          }
          else {
            uVar11 = _DAT_00000028;
            _DAT_00000028 = _DAT_00000028 + uVar16 * 8;
          }
          iVar7 = ((uint)(uVar11 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar11;
          AVar19 = (AllocateResult)(auVar3 << 0x40);
        }
        else {
          AVar19 = BuilderArena::allocate(arena,(SegmentWordCount)uVar16);
          iVar7 = -3;
        }
        uVar14 = (uint)((char)local_90 == '\x06');
        *(int *)&(__return_storage_ptr__->tag).content = iVar7;
        uVar15 = (uint)local_90;
        *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar17 * 8 | uVar15;
      }
      pwVar12 = AVar19.words;
      local_e0 = AVar19.segment;
      if (elementSize == INLINE_COMPOSITE) {
        iVar7 = 0;
        do {
          EVar2 = (lists.ptr)->elementCount;
          if (EVar2 != 0) {
            index = 0;
            do {
              local_c0.data = (void *)((long)&pwVar12->content + ((iVar7 + index) * uVar13 >> 3));
              local_c0.segment = local_e0;
              local_c0.pointers = (WirePointer *)((long)local_c0.data + (ulong)(local_e8 >> 3));
              local_c0.pointerCount = (StructPointerCount)uVar14;
              local_c0.capTable = capTable;
              local_c0.dataSize = local_e8;
              ListReader::getStructElement(&local_60,lists.ptr,index);
              other_00.capTable = local_60.capTable;
              other_00.segment = local_60.segment;
              other_00.data = local_60.data;
              other_00.pointers = local_60.pointers;
              other_00.dataSize = local_60.dataSize;
              other_00.pointerCount = local_60.pointerCount;
              other_00._38_2_ = local_60._38_2_;
              other_00.nestingLimit = local_60.nestingLimit;
              other_00._44_4_ = local_60._44_4_;
              StructBuilder::copyContentFrom(&local_c0,other_00);
              index = index + 1;
            } while (EVar2 != index);
            iVar7 = iVar7 + index;
          }
          lists.ptr = lists.ptr + 1;
        } while (lists.ptr != pLVar8);
      }
      else if (uVar15 == 6) {
        iVar7 = 0;
        do {
          uVar14 = (lists.ptr)->elementCount;
          if ((ulong)uVar14 != 0) {
            uVar16 = 0;
            do {
              local_c0.data =
                   (void *)((long)&pwVar12->content + ((uint)(iVar7 + (int)uVar16) * uVar13 >> 3));
              local_c0.segment = local_e0;
              local_80 = (lists.ptr)->segment;
              pCStack_78 = (lists.ptr)->capTable;
              uVar5 = (lists.ptr)->segment;
              uVar6 = (lists.ptr)->capTable;
              other.capTable = (CapTableReader *)uVar6;
              other.segment = (SegmentReader *)uVar5;
              local_70 = (lists.ptr)->ptr + ((lists.ptr)->step * uVar16 >> 3);
              iStack_68 = (lists.ptr)->nestingLimit;
              other._28_4_ = uStack_64;
              other.nestingLimit = iStack_68;
              other.pointer = (WirePointer *)local_70;
              local_c0.capTable = capTable;
              PointerBuilder::copyFrom((PointerBuilder *)&local_c0,other,false);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
            iVar7 = iVar7 + (int)uVar16;
          }
          lists.ptr = lists.ptr + 1;
        } while (lists.ptr != pLVar8);
      }
      else if (uVar15 == 1) {
        iVar7 = 0;
        do {
          uVar14 = (lists.ptr)->elementCount;
          if (uVar14 != 0) {
            uVar13 = 0;
            do {
              uVar17 = (uint)uVar13;
              uVar16 = (ulong)(iVar7 + uVar17 >> 3);
              bVar10 = (byte)(iVar7 + uVar17) & 7;
              *(byte *)((long)&pwVar12->content + uVar16) =
                   (((lists.ptr)->ptr[uVar13 >> 3] >> (uVar17 & 7) & 1) != 0) << bVar10 |
                   *(byte *)((long)&pwVar12->content + uVar16) & ~(byte)(1 << bVar10);
              uVar17 = uVar17 + 1;
              uVar13 = (ulong)uVar17;
            } while (uVar14 != uVar17);
            iVar7 = iVar7 + uVar17;
          }
          lists.ptr = lists.ptr + 1;
        } while (lists.ptr != pLVar8);
      }
      else {
        lVar9 = 0;
        __dest = pwVar12;
        do {
          uVar16 = (ulong)*(uint *)((long)&(lists.ptr)->elementCount + lVar9) * (uVar13 >> 3);
          if ((int)uVar16 != 0) {
            memcpy(__dest,*(void **)((long)&(lists.ptr)->ptr + lVar9),uVar16 & 0xffffffff);
          }
          __dest = (word *)((long)&__dest->content + uVar16);
          lVar9 = lVar9 + 0x30;
        } while (lists.size_ * 0x30 != lVar9);
      }
      __return_storage_ptr__->segment = local_e0;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->location =
           pwVar12 + ((ulong)(pwVar12 == (word *)0x0 || elementSize != INLINE_COMPOSITE) - 1);
      return __return_storage_ptr__;
    }
  }
  concat::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)__return_storage_ptr__);
LAB_0015163b:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            ((Fault *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xd64,FAILED,"list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT"
             ,"\"can\'t upgrade bit lists to struct lists\"",
             (char (*) [40])"can\'t upgrade bit lists to struct lists");
  kj::_::Debug::Fault::fatal((Fault *)&local_c0);
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}